

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O0

void __thiscall ON_BrepFaceSide::ON_BrepFaceSide(ON_BrepFaceSide *this)

{
  ON_BrepFaceSide *this_local;
  
  ON_Object::ON_Object(&this->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b6c648;
  this->m_faceside_index = -1;
  this->m_ri = -1;
  this->m_fi = -1;
  this->m_srf_dir = 0;
  this->m_rtop = (ON_BrepRegionTopology *)0x0;
  memset(&this->m_faceside_user,0,8);
  return;
}

Assistant:

ON_BrepFaceSide::ON_BrepFaceSide()
{
  m_faceside_index = -1;
  m_ri = -1;
  m_fi = -1;
  m_srf_dir = 0;
  m_rtop = 0;
  memset(&m_faceside_user,0,sizeof(m_faceside_user));
}